

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O0

bool vkt::pipeline::isVertexFormatUscaled(VkFormat format)

{
  bool local_9;
  VkFormat format_local;
  
  switch(format) {
  case VK_FORMAT_A1R5G5B5_UNORM_PACK16:
  case VK_FORMAT_R8_USCALED:
  case VK_FORMAT_R8G8_USCALED:
  case VK_FORMAT_R8G8B8_USCALED:
  case VK_FORMAT_B8G8R8_USCALED:
  case VK_FORMAT_R8G8B8A8_USCALED:
  case VK_FORMAT_B8G8R8A8_USCALED:
  case VK_FORMAT_A2R10G10B10_USCALED_PACK32:
  case VK_FORMAT_A2B10G10R10_USCALED_PACK32:
  case VK_FORMAT_R16_USCALED:
  case VK_FORMAT_R16G16_USCALED:
  case VK_FORMAT_R16G16B16_USCALED:
  case VK_FORMAT_R16G16B16A16_USCALED:
    local_9 = true;
    break;
  default:
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool isVertexFormatUscaled (VkFormat format)
{
	switch (format)
	{
		case VK_FORMAT_R8_USCALED:
		case VK_FORMAT_R8G8_USCALED:
		case VK_FORMAT_R16_USCALED:
		case VK_FORMAT_A1R5G5B5_UNORM_PACK16:
		case VK_FORMAT_R8G8B8_USCALED:
		case VK_FORMAT_B8G8R8_USCALED:
		case VK_FORMAT_R8G8B8A8_USCALED:
		case VK_FORMAT_A2R10G10B10_USCALED_PACK32:
		case VK_FORMAT_R16G16_USCALED:
		case VK_FORMAT_B8G8R8A8_USCALED:
		case VK_FORMAT_A2B10G10R10_USCALED_PACK32:
		case VK_FORMAT_R16G16B16_USCALED:
		case VK_FORMAT_R16G16B16A16_USCALED:
			return true;

		default:
			break;
	}

	return false;

}